

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O0

Variable * deqp::gls::findShaderOutputByName(Shader *shader,char *name)

{
  bool bVar1;
  deBool dVar2;
  reference ppVVar3;
  char *a;
  __normal_iterator<const_rsg::Variable_**,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
  local_60;
  __normal_iterator<const_rsg::Variable_**,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
  local_58;
  __normal_iterator<const_rsg::Variable_*const_*,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
  local_50;
  const_iterator iter;
  undefined1 local_38 [8];
  vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> outputs;
  char *name_local;
  Shader *shader_local;
  
  outputs.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)name;
  std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::vector
            ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)local_38);
  rsg::Shader::getOutputs
            (shader,(vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)
                    local_38);
  local_58._M_current =
       (Variable **)
       std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::begin
                 ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)local_38)
  ;
  __gnu_cxx::
  __normal_iterator<rsg::Variable_const*const*,std::vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>>>
  ::__normal_iterator<rsg::Variable_const**>
            ((__normal_iterator<rsg::Variable_const*const*,std::vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>>>
              *)&local_50,&local_58);
  do {
    local_60._M_current =
         (Variable **)
         std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::end
                   ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)
                    local_38);
    bVar1 = __gnu_cxx::operator!=(&local_50,&local_60);
    if (!bVar1) {
      shader_local = (Shader *)0x0;
LAB_02726fd9:
      std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::~vector
                ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)local_38);
      return (Variable *)shader_local;
    }
    ppVVar3 = __gnu_cxx::
              __normal_iterator<const_rsg::Variable_*const_*,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
              ::operator*(&local_50);
    a = rsg::Variable::getName(*ppVVar3);
    dVar2 = deStringEqual(a,(char *)outputs.
                                    super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (dVar2 != 0) {
      ppVVar3 = __gnu_cxx::
                __normal_iterator<const_rsg::Variable_*const_*,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
                ::operator*(&local_50);
      shader_local = (Shader *)*ppVVar3;
      goto LAB_02726fd9;
    }
    __gnu_cxx::
    __normal_iterator<const_rsg::Variable_*const_*,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
    ::operator++(&local_50);
  } while( true );
}

Assistant:

static const rsg::Variable* findShaderOutputByName (const rsg::Shader& shader, const char* name)
{
	vector<const rsg::Variable*> outputs;
	shader.getOutputs(outputs);

	for (vector<const rsg::Variable*>::const_iterator iter = outputs.begin(); iter != outputs.end(); ++iter)
	{
		if (deStringEqual((*iter)->getName(), name))
			return *iter;
	}

	return DE_NULL;
}